

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

bool __thiscall
DirectorBase::ShouldCut
          (DirectorBase *this,ChessTickType currentTime,int nScore,uint nDepthSearched,
          Position *rootPosition,Moves *mPrincipalVariation)

{
  Moves *mPrincipalVariation_local;
  Position *rootPosition_local;
  uint nDepthSearched_local;
  int nScore_local;
  ChessTickType currentTime_local;
  DirectorBase *this_local;
  
  if (nDepthSearched < 100) {
    if (this->m_nDepth == 0) {
      if (this->m_nMoveTime == 0) {
        if ((this->m_bInfinite & 1U) == 0) {
          if (this->m_SearchStopTime == 0) {
            (*this->_vptr_DirectorBase[5])
                      (this,currentTime,(ulong)(uint)nScore,(ulong)nDepthSearched,rootPosition,
                       mPrincipalVariation);
          }
          this_local._7_1_ = this->m_SearchStopTime <= currentTime;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = (long)(ulong)this->m_nMoveTime <= currentTime;
      }
    }
    else {
      this_local._7_1_ = this->m_nDepth <= nDepthSearched;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool ShouldCut(
        const Clock::ChessTickType currentTime,
        const int nScore,
        const unsigned int nDepthSearched,
        const Position &rootPosition,
        const Moves &mPrincipalVariation
    )
    {
        /* This can happen in late end game. */
        if ( nDepthSearched >= 100 )
            return true;

        if ( m_nDepth != 0 )
            return ( nDepthSearched >= m_nDepth );

        if ( m_nMoveTime != 0 )
            return ( currentTime >= m_nMoveTime );

        if ( m_bInfinite )
            return false;

        if ( m_SearchStopTime == 0 )
            CalculateSearchStopTime( currentTime, nScore, nDepthSearched,
                                     rootPosition, mPrincipalVariation );

        return ( currentTime >= m_SearchStopTime );
    }